

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateProfiledNewScIntArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef)

{
  Func *func;
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  uint uVar4;
  AddrOpnd *pAVar5;
  LabelInstr *helperLabel;
  RegOpnd *pRVar6;
  RegOpnd *opnd;
  AddrOpnd *value;
  IndirOpnd *src;
  undefined4 *puVar7;
  LabelInstr *target;
  ArrayCallSiteInfo *arrayInfo_00;
  int iVar8;
  ulong uVar9;
  undefined1 local_98 [8];
  AutoReuseOpnd autoReuseHeadOpnd;
  AutoReuseOpnd autoReuseDstElementsOpnd;
  uint local_38;
  bool local_31;
  uint32 size;
  bool isHeadSegmentZeroed;
  
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,ArrayLiteralFastPathPhase,sourceContextId,functionId);
  if ((!bVar3) && (DAT_0143bfb9 == '\0')) {
    bVar3 = Js::ArrayCallSiteInfo::IsNativeIntArray(arrayInfo);
    if (bVar3) {
      pAVar5 = IR::Opnd::AsAddrOpnd(instr->m_src1);
      if (pAVar5->addrOpndKind == AddrOpndKindDynamicAuxBufferRef) {
        func = this->m_func;
        helperLabel = IR::LabelInstr::New(Label,func,true);
        GenerateArrayInfoIsNativeIntArrayTest(this,instr,arrayInfo_00,arrayInfoAddr,helperLabel);
        pAVar5 = IR::Opnd::AsAddrOpnd(instr->m_src1);
        puVar1 = (uint *)pAVar5->m_metadata;
        local_38 = *puVar1;
        pRVar6 = IR::Opnd::AsRegOpnd(instr->m_dst);
        opnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeIntArray>
                         (this,instr,&local_38,arrayInfo,&local_31);
        IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_98,&opnd->super_Opnd,func,true);
        value = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
        GenerateMemInit(this,pRVar6,0x38,&value->super_Opnd,instr,false);
        uVar4 = *puVar1;
        if (uVar4 < 0x11) {
          iVar8 = 0x18;
          for (uVar9 = 0; uVar9 < uVar4; uVar9 = uVar9 + 1) {
            GenerateMemInit(this,opnd,iVar8,puVar1[uVar9 + 1],instr,local_31);
            uVar4 = *puVar1;
            iVar8 = iVar8 + 4;
          }
        }
        else {
          pRVar6 = IR::RegOpnd::New(TyUint64,func);
          IR::AutoReuseOpnd::AutoReuseOpnd
                    ((AutoReuseOpnd *)&autoReuseHeadOpnd.autoDelete,&pRVar6->super_Opnd,func,true);
          pAVar5 = IR::AddrOpnd::New((long)pAVar5->m_address + 4,AddrOpndKindDynamicMisc,func,false,
                                     (Var)0x0);
          src = IR::IndirOpnd::New(opnd,0x18,TyUint64,func,false);
          InsertLea(pRVar6,&src->super_Opnd,instr);
          GenerateMemCopy(this,&pRVar6->super_Opnd,&pAVar5->super_Opnd,*puVar1 << 2,instr);
          uVar9 = (ulong)*puVar1;
          IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseHeadOpnd.autoDelete);
          uVar4 = *puVar1;
        }
        if ((uint)uVar9 != uVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x109b,"(i == ints->count)","i == ints->count");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
        iVar8 = (uint)uVar9 * 4 + 0x18;
        for (; (uint)uVar9 < local_38; uVar9 = (ulong)((uint)uVar9 + 1)) {
          GenerateMemInit(this,opnd,iVar8,-0x7fffe,instr,local_31);
          iVar8 = iVar8 + 4;
        }
        target = IR::LabelInstr::New(Label,func,false);
        InsertBranch(Br,target,instr);
        IR::Instr::InsertBefore(instr,&helperLabel->super_Instr);
        IR::Instr::InsertAfter(instr,&target->super_Instr);
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_98);
      }
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateProfiledNewScIntArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef)
{
    // Helper will deal with ForceES5ARray
    if (PHASE_OFF(Js::ArrayLiteralFastPathPhase, m_func) || CONFIG_FLAG(ForceES5Array))
    {
        return;
    }

    if (!arrayInfo->IsNativeIntArray())
    {
        return;
    }

    if (instr->GetSrc1()->AsAddrOpnd()->GetAddrOpndKind() != IR::AddrOpndKindDynamicAuxBufferRef)
    {
        return;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);

    GenerateArrayInfoIsNativeIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);

    IR::AddrOpnd * elementsOpnd = instr->GetSrc1()->AsAddrOpnd();
    Js::AuxArray<int32> * ints = (Js::AuxArray<int32> *)elementsOpnd->m_metadata;
    uint32 size = ints->count;

    // Generate code as in JavascriptArray::NewLiteral
    bool isHeadSegmentZeroed;
    IR::RegOpnd * dstOpnd = instr->GetDst()->AsRegOpnd();
    Assert(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex());
    IR::RegOpnd * headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeIntArray>(instr, &size, arrayInfo, &isHeadSegmentZeroed);
    const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

    GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicMisc, m_func), instr, isHeadSegmentZeroed);

    // Initialize the elements
    uint i = 0;
    if (ints->count > 16)
    {
        // Do memcpy if > 16
        IR::RegOpnd * dstElementsOpnd = IR::RegOpnd::New(TyMachPtr, func);
        const IR::AutoReuseOpnd autoReuseDstElementsOpnd(dstElementsOpnd, func);
        IR::Opnd * srcOpnd = IR::AddrOpnd::New((intptr_t)elementsOpnd->m_address + Js::AuxArray<int32>::OffsetOfElements(), IR::AddrOpndKindDynamicMisc, func);
        InsertLea(dstElementsOpnd, IR::IndirOpnd::New(headOpnd, sizeof(Js::SparseArraySegmentBase), TyMachPtr, func), instr);
        GenerateMemCopy(dstElementsOpnd, srcOpnd, ints->count * sizeof(int32), instr);
        i = ints->count;
    }
    else
    {
        for (; i < ints->count; i++)
        {
            GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
                ints->elements[i], instr, isHeadSegmentZeroed);
        }
    }
    Assert(i == ints->count);
    for (; i < size; i++)
    {
        GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
            Js::JavascriptNativeIntArray::MissingItem, instr, isHeadSegmentZeroed);
    }
    // Skip pass the helper call
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
}